

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O2

void __thiscall CLI::App::_process_env(App *this)

{
  bool bVar1;
  pointer puVar2;
  Option *pOVar3;
  pointer psVar4;
  char *pcVar5;
  pointer puVar6;
  App_p *sub;
  pointer psVar7;
  string ename_string;
  allocator local_99;
  undefined1 *local_98;
  long local_90;
  undefined1 local_88 [16];
  App *local_78;
  string local_70;
  string local_50 [32];
  
  puVar2 = (this->options_).
           super__Vector_base<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_78 = this;
  for (puVar6 = (this->options_).
                super__Vector_base<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start; puVar6 != puVar2; puVar6 = puVar6 + 1) {
    pOVar3 = (puVar6->_M_t).super___uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>.
             _M_t.super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>.
             super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl;
    if ((*(pointer *)
          ((long)&(pOVar3->results_).
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          + 8) == *(pointer *)
                   &(pOVar3->results_).
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl) && ((pOVar3->envname_)._M_string_length != 0)) {
      local_98 = local_88;
      local_90 = 0;
      local_88[0] = 0;
      pcVar5 = getenv((pOVar3->envname_)._M_dataplus._M_p);
      if (pcVar5 != (char *)0x0) {
        ::std::__cxx11::string::string(local_50,pcVar5,&local_99);
        ::std::__cxx11::string::operator=((string *)&local_98,local_50);
        ::std::__cxx11::string::~string(local_50);
        if (local_90 != 0) {
          pOVar3 = (puVar6->_M_t).
                   super___uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>._M_t.
                   super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>.
                   super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl;
          ::std::__cxx11::string::string((string *)&local_70,(string *)&local_98);
          Option::add_result(pOVar3,&local_70);
          ::std::__cxx11::string::~string((string *)&local_70);
        }
      }
      ::std::__cxx11::string::~string((string *)&local_98);
    }
  }
  psVar7 = (local_78->subcommands_).
           super__Vector_base<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  psVar4 = (local_78->subcommands_).
           super__Vector_base<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  do {
    if (psVar7 == psVar4) {
      return;
    }
    ::std::__cxx11::string::string
              ((string *)&local_98,
               (string *)
               &((psVar7->super___shared_ptr<CLI::App,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->name_);
    if (local_90 == 0) {
      ::std::__cxx11::string::~string((string *)&local_98);
LAB_00140d9f:
      _process_env((psVar7->super___shared_ptr<CLI::App,_(__gnu_cxx::_Lock_policy)2>)._M_ptr);
    }
    else {
      bVar1 = ((psVar7->super___shared_ptr<CLI::App,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
              immediate_callback_;
      ::std::__cxx11::string::~string((string *)&local_98);
      if (bVar1 == false) goto LAB_00140d9f;
    }
    psVar7 = psVar7 + 1;
  } while( true );
}

Assistant:

auto to_string(T &&value) -> decltype(std::forward<T>(value)) {
    return std::forward<T>(value);
}